

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl
          (cmLinkedTree<cmStateDetail::PolicyStackEntry> *this,iterator it,PolicyStackEntry *t)

{
  ulong uVar1;
  iterator iVar2;
  iterator it_local;
  
  it_local.Position = it.Position;
  it_local.Tree = it.Tree;
  uVar1 = (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar1 != ((long)(this->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                  ,0xb5,
                  "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  if (it_local.Position <= uVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->UpPositions,&it_local.Position);
    std::vector<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>::
    emplace_back<cmStateDetail::PolicyStackEntry>(&this->Data,t);
    iVar2.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar2.Tree = this;
    return iVar2;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                ,0xb6,
                "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

iterator Push_impl(iterator it, T&& t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(std::move(t));
    return iterator(this, this->UpPositions.size());
  }